

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.hpp
# Opt level: O1

void __thiscall
duckdb::Connection::
CreateVectorizedFunction<duckdb::string_t,duckdb::string_t,duckdb::string_t,duckdb::string_t>
          (Connection *this,string *name,scalar_function_t *udf_func,LogicalType *varargs)

{
  type context;
  _Any_data _Stack_58;
  _Manager_type local_48;
  LogicalType local_38 [24];
  
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::function
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             &_Stack_58,udf_func);
  context = shared_ptr<duckdb::ClientContext,_true>::operator*
                      ((shared_ptr<duckdb::ClientContext,_true> *)this);
  duckdb::LogicalType::LogicalType(local_38,varargs);
  UDFWrapper::RegisterFunction<duckdb::string_t,duckdb::string_t,duckdb::string_t,duckdb::string_t>
            (name,(scalar_function_t *)&_Stack_58,context,local_38);
  duckdb::LogicalType::~LogicalType(local_38);
  if (local_48 != (code *)0x0) {
    (*local_48)(&_Stack_58,&_Stack_58,__destroy_functor);
  }
  return;
}

Assistant:

void CreateVectorizedFunction(const string &name, scalar_function_t udf_func,
	                              LogicalType varargs = LogicalType::INVALID) {
		UDFWrapper::RegisterFunction<TR, ARGS...>(name, udf_func, *context, std::move(varargs));
	}